

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O0

void * QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)

{
  ulong uVar1;
  long lVar2;
  QXcbEglIntegration *this;
  QXcbEglWindow *local_20;
  void *local_8;
  
  uVar1 = QSurface::supportsOpenGL();
  if (((uVar1 & 1) == 0) || (lVar2 = QWindow::handle(), lVar2 != 0)) {
    uVar1 = QSurface::supportsOpenGL();
    if ((uVar1 & 1) == 0) {
      local_8 = (void *)0x0;
    }
    else {
      lVar2 = QWindow::handle();
      if (lVar2 == 0) {
        local_20 = (QXcbEglWindow *)0x0;
      }
      else {
        local_20 = (QXcbEglWindow *)(lVar2 + -0x20);
      }
      this = QXcbEglWindow::glIntegration(local_20);
      local_8 = QXcbEglIntegration::eglDisplay(this);
    }
  }
  else {
    local_8 = eglDisplay();
  }
  return local_8;
}

Assistant:

void *QXcbEglNativeInterfaceHandler::eglDisplayForWindow(QWindow *window)
{
    Q_ASSERT(window);
    if (window->supportsOpenGL() && window->handle() == nullptr)
        return eglDisplay();
    else if (window->supportsOpenGL())
        return static_cast<QXcbEglWindow *>(window->handle())->glIntegration()->eglDisplay();
    return nullptr;
}